

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::ConvertModel
          (FBXConverter *this,Model *model,aiNode *parent,aiNode *root_node,
          aiMatrix4x4 *absolute_transform)

{
  uint uVar1;
  pointer ppGVar2;
  Geometry *pGVar3;
  pointer puVar4;
  MeshGeometry *mesh;
  LineGeometry *line;
  uint *__s;
  pointer ppGVar5;
  ulong uVar6;
  _Alloc_hider _Var7;
  ulong __n;
  pointer puVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  aiNode *local_1f0;
  FBXConverter *local_1e8;
  aiNode *local_1e0;
  aiNode *local_1d8;
  aiMatrix4x4 *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  uint *local_1a8;
  uint *local_1a0;
  long local_198;
  ios_base local_138 [264];
  
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = parent;
  local_1e8 = this;
  local_1e0 = root_node;
  local_1d0 = absolute_transform;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_208,
             (long)(model->geometry).
                   super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model->geometry).
                   super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppGVar5 = (model->geometry).
            super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppGVar2 = (model->geometry).
            super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_1d8 = (aiNode *)model;
  if (ppGVar5 != ppGVar2) {
    do {
      pGVar3 = *ppGVar5;
      if (pGVar3 == (Geometry *)0x0) {
        mesh = (MeshGeometry *)0x0;
        line = (LineGeometry *)0x0;
      }
      else {
        mesh = (MeshGeometry *)__dynamic_cast(pGVar3,&Geometry::typeinfo,&MeshGeometry::typeinfo);
        root_node = (aiNode *)0x0;
        line = (LineGeometry *)__dynamic_cast(pGVar3,&Geometry::typeinfo,&LineGeometry::typeinfo);
      }
      if (mesh == (MeshGeometry *)0x0) {
        if (line != (LineGeometry *)0x0) {
          ConvertLine((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8,local_1e8,
                      line,(Model *)root_node,(aiNode *)absolute_transform,local_1e0);
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (local_1a8,local_1a0,&local_208);
          goto LAB_005f1636;
        }
        std::operator+(&local_1c8,"ignoring unrecognized geometry: ",&(pGVar3->super_Object).name);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
                   &local_1c8);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          uVar6 = local_1c8.field_2._M_allocated_capacity + 1;
          _Var7._M_p = local_1c8._M_dataplus._M_p;
          goto LAB_005f164b;
        }
      }
      else {
        root_node = local_1d8;
        absolute_transform = (aiMatrix4x4 *)local_1f0;
        ConvertMesh((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8,local_1e8,mesh
                    ,(Model *)local_1d8,local_1f0,local_1e0,local_1d0);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (local_1a8,local_1a0,&local_208);
LAB_005f1636:
        if (local_1a8 != (uint *)0x0) {
          uVar6 = local_198 - (long)local_1a8;
          _Var7._M_p = (pointer)local_1a8;
LAB_005f164b:
          operator_delete(_Var7._M_p,uVar6);
        }
      }
      ppGVar5 = ppGVar5 + 1;
    } while (ppGVar5 != ppGVar2);
  }
  puVar4 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar6 = (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    __n = -(ulong)(uVar6 >> 0x3e != 0) |
          (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    __s = (uint *)operator_new__(__n);
    memset(__s,0,__n);
    local_1f0->mMeshes = __s;
    local_1f0->mNumMeshes = (uint)uVar6;
    for (; puVar8 != puVar4; puVar8 = puVar8 + 1) {
      uVar1 = *puVar8;
      *puVar8 = *__s;
      *__s = uVar1;
      __s = __s + 1;
    }
  }
  if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::ConvertModel(const Model &model, aiNode *parent, aiNode *root_node,
                                        const aiMatrix4x4 &absolute_transform)
        {
            const std::vector<const Geometry*>& geos = model.GetGeometry();

            std::vector<unsigned int> meshes;
            meshes.reserve(geos.size());

            for (const Geometry* geo : geos) {

                const MeshGeometry* const mesh = dynamic_cast<const MeshGeometry*>(geo);
                const LineGeometry* const line = dynamic_cast<const LineGeometry*>(geo);
                if (mesh) {
                    const std::vector<unsigned int>& indices = ConvertMesh(*mesh, model, parent, root_node,
                                                                           absolute_transform);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else if (line) {
                    const std::vector<unsigned int>& indices = ConvertLine(*line, model, parent, root_node);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else {
                    FBXImporter::LogWarn("ignoring unrecognized geometry: " + geo->Name());
                }
            }

            if (meshes.size()) {
                parent->mMeshes = new unsigned int[meshes.size()]();
                parent->mNumMeshes = static_cast<unsigned int>(meshes.size());

                std::swap_ranges(meshes.begin(), meshes.end(), parent->mMeshes);
            }
        }